

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_frame_codec.c
# Opt level: O0

void amqp_value_decoded(void *context,AMQP_VALUE decoded_value)

{
  _Bool _Var1;
  AMQP_VALUE descriptor_00;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  AMQP_VALUE descriptor;
  SASL_FRAME_CODEC_INSTANCE *sasl_frame_codec_instance;
  AMQP_VALUE decoded_value_local;
  void *context_local;
  
  descriptor_00 = amqpvalue_get_inplace_descriptor(decoded_value);
  if (descriptor_00 == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                ,"amqp_value_decoded",0x32,1,"Cannot get frame descriptor");
    }
    *(undefined4 *)((long)context + 0x28) = 1;
    (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18));
  }
  else {
    _Var1 = is_sasl_mechanisms_type_by_descriptor(descriptor_00);
    if ((((_Var1) || (_Var1 = is_sasl_init_type_by_descriptor(descriptor_00), _Var1)) ||
        (_Var1 = is_sasl_challenge_type_by_descriptor(descriptor_00), _Var1)) ||
       ((_Var1 = is_sasl_response_type_by_descriptor(descriptor_00), _Var1 ||
        (_Var1 = is_sasl_outcome_type_by_descriptor(descriptor_00), _Var1)))) {
      *(AMQP_VALUE *)((long)context + 0x30) = decoded_value;
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/sasl_frame_codec.c"
                  ,"amqp_value_decoded",0x41,1,"Not a SASL frame");
      }
      *(undefined4 *)((long)context + 0x28) = 1;
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x18));
    }
  }
  return;
}

Assistant:

static void amqp_value_decoded(void* context, AMQP_VALUE decoded_value)
{
    SASL_FRAME_CODEC_INSTANCE* sasl_frame_codec_instance = (SASL_FRAME_CODEC_INSTANCE*)context;
    AMQP_VALUE descriptor = amqpvalue_get_inplace_descriptor(decoded_value);

    if (descriptor == NULL)
    {
        LogError("Cannot get frame descriptor");
        sasl_frame_codec_instance->decode_state = SASL_FRAME_DECODE_ERROR;

        /* Codes_SRS_SASL_FRAME_CODEC_01_049: [If any error occurs while decoding a frame, the decoder shall call the on_sasl_frame_codec_error and pass to it the callback_context, both of those being the ones given to sasl_frame_codec_create.] */
        sasl_frame_codec_instance->on_sasl_frame_codec_error(sasl_frame_codec_instance->callback_context);
    }
    else
    {
        /* Codes_SRS_SASL_FRAME_CODEC_01_009: [The frame body of a SASL frame MUST contain exactly one AMQP type, whose type encoding MUST have provides="sasl-frame".] */
        if (!is_sasl_mechanisms_type_by_descriptor(descriptor) &&
            !is_sasl_init_type_by_descriptor(descriptor) &&
            !is_sasl_challenge_type_by_descriptor(descriptor) &&
            !is_sasl_response_type_by_descriptor(descriptor) &&
            !is_sasl_outcome_type_by_descriptor(descriptor))
        {
            LogError("Not a SASL frame");
            sasl_frame_codec_instance->decode_state = SASL_FRAME_DECODE_ERROR;

            /* Codes_SRS_SASL_FRAME_CODEC_01_049: [If any error occurs while decoding a frame, the decoder shall call the on_sasl_frame_codec_error and pass to it the callback_context, both of those being the ones given to sasl_frame_codec_create.] */
            sasl_frame_codec_instance->on_sasl_frame_codec_error(sasl_frame_codec_instance->callback_context);
        }
        else
        {
            sasl_frame_codec_instance->decoded_sasl_frame_value = decoded_value;
        }
    }
}